

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

size_t __thiscall cppurses::Text_display::index_at(Text_display *this,Point position)

{
  pointer pLVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = position.x;
  uVar4 = position.y + this->top_line_;
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->display_state_).
                super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4;
  if (uVar3 <= uVar4) {
LAB_0014717c:
    return ((long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                  super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                  super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  if (pLVar1[uVar4].length <= uVar5) {
    if (pLVar1[uVar4].length != 0) {
      if (uVar4 != uVar3 - 1) {
        sVar2 = first_index_at(this,uVar4 + 1);
        return sVar2 - 1;
      }
      goto LAB_0014717c;
    }
    uVar5 = 0;
  }
  return uVar5 + pLVar1[uVar4].start_index;
}

Assistant:

std::size_t Text_display::index_at(Point position) const {
    auto line = this->top_line() + position.y;
    if (line >= display_state_.size()) {
        return this->contents().size();
    }
    auto info = display_state_.at(line);
    if (position.x >= info.length) {
        if (info.length == 0) {
            position.x = 0;
        } else if (this->top_line() + position.y != this->last_line()) {
            return this->first_index_at(this->top_line() + position.y + 1) - 1;
        } else if (this->top_line() + position.y == this->last_line()) {
            return this->contents().size();
        } else {
            position.x = info.length - 1;
        }
    }
    return info.start_index + position.x;
}